

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

Result __thiscall
presolve::HPresolve::runProbing(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  HighsCliqueTable *this_00;
  double *pdVar1;
  pointer puVar2;
  double dVar3;
  double newLower;
  HighsMipSolverData *pHVar4;
  HighsMipSolver *pHVar5;
  HighsMipSolverData *pHVar6;
  HighsMipSolverData *pHVar7;
  long lVar8;
  pointer pCVar9;
  pointer pHVar10;
  pointer pSVar11;
  int *piVar12;
  pointer piVar13;
  pointer ppVar14;
  pointer pdVar15;
  _Manager_type p_Var16;
  uint uVar17;
  bool bVar18;
  HighsInt HVar19;
  HighsInt HVar20;
  Result RVar21;
  Result RVar22;
  long lVar23;
  HighsLp *pHVar24;
  uint uVar25;
  int iVar26;
  _func_void__Any_data_ptr_int_ptr_int_ptr_int_ptr_double_ptr *__tmp_1;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp;
  ulong uVar27;
  HighsDomain *pHVar28;
  int iVar29;
  int iVar30;
  ulong uVar31;
  HighsMipAnalysis *this_01;
  long lVar32;
  HighsImplications *this_02;
  long lVar33;
  long lVar34;
  pointer ptVar35;
  long lVar36;
  _Any_data *p_Var37;
  int iVar38;
  iterator __end2;
  long lVar39;
  iterator __begin2;
  ulong uVar40;
  pointer ptVar41;
  int *piVar42;
  pointer ppVar43;
  bool bVar44;
  double dVar45;
  size_t numLiftOpps;
  HighsInt numBoundChgs;
  vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
  binaries;
  int local_f4;
  ulong local_e8;
  ulong local_e0;
  _Any_data *local_d8;
  long local_d0;
  HighsPostsolveStack *local_c8;
  long local_c0;
  HighsImplications *local_b8;
  pointer local_b0;
  ulong local_a8;
  HighsDomain *local_a0;
  int local_98;
  HighsInt local_94;
  uint local_90;
  int local_8c;
  _Any_data local_88;
  _Manager_type local_78;
  _Invoker_type p_Stack_70;
  vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
  local_68;
  _Manager_type *local_48;
  ulong local_40;
  ulong local_38;
  
  HighsMipAnalysis::mipTimerStart(&this->mipsolver->analysis_,0xb);
  this->probingEarlyAbort = false;
  if (this->numDeletedCols + this->numDeletedRows != 0) {
    shrinkProblem(this,postsolve_stack);
  }
  pHVar24 = this->model;
  toCSC(this,&(pHVar24->a_matrix_).value_,&(pHVar24->a_matrix_).index_,&(pHVar24->a_matrix_).start_)
  ;
  pHVar24 = this->model;
  okFromCSC(this,&(pHVar24->a_matrix_).value_,&(pHVar24->a_matrix_).index_,
            &(pHVar24->a_matrix_).start_);
  (((this->mipsolver->mipdata_)._M_t.
    super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
    super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
    super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->cliquetable).maxEntries =
       ((int)((ulong)((long)(this->Avalue).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->Avalue).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 3) -
       (int)((ulong)((long)(this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2)) * 10 + 2000000;
  pHVar24 = this->model;
  if (pHVar24->num_col_ != 0) {
    dVar45 = this->primal_feastol / 1e-14;
    uVar40 = 0;
    do {
      dVar3 = (pHVar24->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar40];
      newLower = (this->implColLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar40];
      if ((dVar3 < newLower) ||
         ((this->implColUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar40] <
          (pHVar24->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar40])) {
        if ((dVar3 < newLower) && (ABS(newLower) <= dVar45)) {
          changeColLower(this,(HighsInt)uVar40,newLower);
        }
        dVar3 = (this->implColUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar40];
        if ((ABS(dVar3) <= dVar45) &&
           (dVar3 < (this->model->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar40])) {
          changeColUpper(this,(HighsInt)uVar40,dVar3);
        }
      }
      uVar40 = uVar40 + 1;
      pHVar24 = this->model;
    } while (uVar40 != (uint)pHVar24->num_col_);
  }
  HVar19 = this->numProbed;
  HighsMipSolverData::setupDomainPropagation
            ((this->mipsolver->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl);
  pHVar4 = (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  pHVar28 = &pHVar4->domain;
  HighsDomain::propagate(pHVar28);
  pHVar5 = this->mipsolver;
  if ((pHVar4->domain).infeasible_ != false) {
    this_01 = &pHVar5->analysis_;
    goto LAB_003114bc;
  }
  pHVar6 = (pHVar5->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  this_00 = &pHVar6->cliquetable;
  bVar44 = pHVar6->cliquesExtracted;
  pHVar6->cliquesExtracted = true;
  if (bVar44 == false) {
    local_a0 = pHVar28;
    HighsCliqueTable::extractCliques(this_00,pHVar5,true);
    pHVar5 = this->mipsolver;
    if ((pHVar4->domain).infeasible_ == true) {
      HighsMipAnalysis::mipTimerStop(&pHVar5->analysis_,0xb);
      return kPrimalInfeasible;
    }
    pHVar7 = (pHVar5->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    dVar45 = pHVar7->upper_limit;
    if (dVar45 < INFINITY) {
      pHVar7->upper_limit = dVar45 - this->model->offset_;
      HighsCliqueTable::extractObjCliques(this_00,pHVar5);
      pHVar5 = this->mipsolver;
      ((pHVar5->mipdata_)._M_t.
       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
       super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->upper_limit = dVar45;
      if ((pHVar4->domain).infeasible_ == true) {
        this_01 = &pHVar5->analysis_;
        goto LAB_003114bc;
      }
    }
    pHVar28 = local_a0;
    HighsDomain::propagate(local_a0);
    if ((pHVar4->domain).infeasible_ != true) goto LAB_003110ee;
  }
  else {
LAB_003110ee:
    HighsCliqueTable::cleanupFixed(this_00,pHVar28);
    if ((pHVar4->domain).infeasible_ != true) {
      local_68.
      super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.
      super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pHVar7 = (this->mipsolver->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      local_c8 = postsolve_stack;
      local_a0 = pHVar28;
      local_94 = HVar19;
      if ((pHVar7->cliquetable).numEntries < (pHVar7->cliquetable).maxEntries) {
        std::
        vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>::
        reserve(&local_68,(long)this->model->num_col_);
        uVar40 = (ulong)(uint)(this->options->super_HighsOptionsStruct).random_seed;
        lVar23 = uVar40 + 0x8a183895eeac1536;
        do {
          uVar27 = ((uVar40 >> 0x20) + 0x80c8963be3e4c2f3) *
                   ((uVar40 & 0xffffffff) + 0xc8497d2a400d9551);
          uVar31 = ((uVar27 >> 0x20) + 0x42d8680e260ae5b) * lVar23 >> 0x20;
          uVar40 = uVar31 ^ uVar27;
        } while (uVar27 - uVar31 == 0);
        local_e8 = local_e8 & 0xffffffff00000000;
        if (this->model->num_col_ != 0) {
          iVar29 = 0;
          do {
            lVar23 = (long)iVar29;
            if ((((*(char *)(*(long *)&(((pHVar4->domain).mipsolver)->model_->integrality_).
                                       super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
                                       ._M_impl + lVar23) != '\0') &&
                 (dVar45 = *(double *)
                            (*(long *)&(pHVar4->domain).col_lower_.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl +
                            lVar23 * 8), dVar45 == 0.0)) && (!NAN(dVar45))) &&
               ((dVar45 = *(double *)
                           (*(long *)&(pHVar4->domain).col_upper_.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl +
                           lVar23 * 8), dVar45 == 1.0 && (!NAN(dVar45))))) {
              HVar19 = HighsCliqueTable::getNumImplications(this_00,iVar29,true);
              HVar20 = HighsCliqueTable::getNumImplications(this_00,(HighsInt)local_e8,false);
              lVar23 = (long)HVar20 * (long)HVar19;
              if (4999 < lVar23) {
                lVar23 = 5000;
              }
              local_88._M_unused._0_8_ =
                   (undefined8)
                   ((double)-lVar23 /
                   ((double)(this->numProbes).
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start[(HighsInt)local_e8] + 1.0));
              local_8c = HVar20 + HVar19;
              if (99 < local_8c) {
                local_8c = 100;
              }
              local_8c = -local_8c;
              uVar40 = uVar40 >> 0xc ^ uVar40;
              uVar40 = uVar40 << 0x19 ^ uVar40;
              uVar40 = uVar40 >> 0x1b ^ uVar40;
              local_90 = (uint)(((uVar40 >> 0x20) + 0x80c8963be3e4c2f3) *
                                ((uVar40 & 0xffffffff) + 0xc8497d2a400d9551) >> 0x21);
              std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>
              ::emplace_back<double,int,int,int&>
                        ((vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>
                          *)&local_68,(double *)&local_88,&local_8c,(int *)&local_90,
                         (int *)&local_e8);
            }
            iVar29 = (HighsInt)local_e8 + 1;
            local_e8 = CONCAT44(local_e8._4_4_,iVar29);
          } while (iVar29 != this->model->num_col_);
        }
      }
      if (local_68.
          super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_68.
          super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        uVar40 = ((long)local_68.
                        super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_68.
                        super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        iVar29 = 0;
        if (1 < uVar40) {
          iVar29 = 0;
          do {
            uVar40 = (long)uVar40 >> 1;
            iVar29 = iVar29 + 1;
          } while (1 < uVar40);
        }
        pdqsort_detail::
        pdqsort_loop<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>,false>
                  (local_68.
                   super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_68.
                   super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,iVar29,1);
        lVar23 = *(long *)&(pHVar4->domain).changedcols_.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl;
        local_c0 = (long)*(pointer *)((long)&(pHVar4->domain).changedcols_ + 8) - lVar23;
        if (local_c0 == 0) {
          local_c0 = 0;
        }
        else {
          local_c0 = local_c0 >> 2;
          lVar39 = *(long *)&(pHVar4->domain).col_lower_.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl;
          lVar8 = *(long *)&(pHVar4->domain).col_upper_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl;
          iVar29 = this->probingNumDelCol;
          lVar33 = 0;
          do {
            lVar36 = (long)*(int *)(lVar23 + lVar33 * 4);
            dVar45 = *(double *)(lVar39 + lVar36 * 8);
            pdVar1 = (double *)(lVar8 + lVar36 * 8);
            if ((dVar45 == *pdVar1) && (!NAN(dVar45) && !NAN(*pdVar1))) {
              iVar29 = iVar29 + 1;
              this->probingNumDelCol = iVar29;
            }
            lVar33 = lVar33 + 1;
          } while (local_c0 != lVar33);
        }
        pCVar9 = *(pointer *)((long)&(pHVar6->cliquetable).cliques + 8);
        lVar23 = *(long *)&(pHVar6->cliquetable).cliques.
                           super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                           ._M_impl;
        local_e0 = (long)*(pointer *)((long)&(pHVar6->cliquetable).freeslots + 8) -
                   *(long *)&(pHVar6->cliquetable).freeslots.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl;
        pHVar10 = *(pointer *)((long)&(pHVar6->implications).substitutions + 8);
        lVar39 = *(long *)&(pHVar6->implications).substitutions.
                           super__Vector_base<HighsSubstitution,_std::allocator<HighsSubstitution>_>
                           ._M_impl;
        pSVar11 = *(pointer *)((long)&(pHVar6->cliquetable).substitutions + 8);
        lVar8 = *(long *)&(pHVar6->cliquetable).substitutions.
                          super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                          ._M_impl;
        local_98 = (int)(pHVar6->implications).numImplications;
        local_40 = (ulong)(uint)this->probingNumDelCol;
        uVar25 = 100000;
        if (this->mipsolver->submip != false) {
          uVar25 = 0;
        }
        iVar29 = (int)((ulong)((long)(this->Avalue).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(this->Avalue).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 3) -
                 (int)((ulong)((long)(this->freeslots).super__Vector_base<int,_std::allocator<int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->freeslots).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2);
        uVar17 = iVar29 * 10;
        if (uVar25 == uVar17 || SBORROW4(uVar25,uVar17) != (int)(uVar25 + iVar29 * -10) < 0) {
          uVar25 = uVar17;
        }
        uVar40 = (long)this->model->num_row_ * 10;
        local_d0 = (ulong)uVar25 + (pHVar6->cliquetable).numNeighbourhoodQueries;
        local_38 = 100000;
        if (100000 < uVar40) {
          local_38 = uVar40;
        }
        local_e8 = 0;
        if ((this->mipsolver->options_mip_->super_HighsOptionsStruct).mip_lifting_for_probing != -1)
        {
          lVar33 = (long)(this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
          if (lVar33 == 0) {
            uVar40 = 0;
            uVar27 = 0;
          }
          else {
            lVar33 = lVar33 >> 2;
            lVar32 = 0;
            lVar34 = 0;
            lVar36 = 0;
            do {
              if ((this->colDeleted).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar32] == '\0') {
                lVar36 = lVar36 + 1;
                lVar34 = lVar34 + (ulong)((this->model->integrality_).
                                          super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
                                          ._M_impl.super__Vector_impl_data._M_start[lVar32] ==
                                         kContinuous);
              }
              lVar32 = lVar32 + 1;
            } while (lVar33 + (ulong)(lVar33 == 0) != lVar32);
            uVar27 = lVar34 * 100;
            uVar40 = lVar36 * 2;
          }
          if (uVar40 <= uVar27) {
            local_88._M_unused._0_8_ =
                 (undefined8)
                 *(undefined8 *)
                  &(pHVar6->implications).storeLiftingOpportunity.super__Function_base._M_functor;
            local_88._8_8_ =
                 *(undefined8 *)((long)&(pHVar6->implications).storeLiftingOpportunity + 8);
            *(HPresolve **)
             &(pHVar6->implications).storeLiftingOpportunity.super__Function_base._M_functor = this;
            *(ulong **)((long)&(pHVar6->implications).storeLiftingOpportunity + 8) = &local_e8;
            local_78 = *(_Manager_type *)
                        ((long)&(pHVar6->implications).storeLiftingOpportunity + 0x10);
            *(code **)((long)&(pHVar6->implications).storeLiftingOpportunity + 0x10) =
                 std::
                 _Function_handler<void_(int,_int,_int,_double),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/presolve/HPresolve.cpp:1529:46)>
                 ::_M_manager;
            p_Stack_70 = *(_Invoker_type *)
                          ((long)&(pHVar6->implications).storeLiftingOpportunity + 0x18);
            *(code **)((long)&(pHVar6->implications).storeLiftingOpportunity + 0x18) =
                 std::
                 _Function_handler<void_(int,_int,_int,_double),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/presolve/HPresolve.cpp:1529:46)>
                 ::_M_invoke;
            if (local_78 != (_Manager_type)0x0) {
              (*local_78)(&local_88,&local_88,__destroy_functor);
            }
          }
        }
        if (local_68.
            super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_68.
            super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          this_02 = &pHVar6->implications;
          uVar40 = (ulong)(uint)((int)(local_e0 >> 2) +
                                (int)((ulong)((long)pCVar9 - lVar23) >> 2) * 0x33333333);
          iVar29 = (int)((ulong)((long)pSVar11 - lVar8) >> 3) +
                   (int)((ulong)((long)pHVar10 - lVar39) >> 3) * -0x55555555;
          local_48 = (_Manager_type *)((long)&(pHVar6->implications).storeLiftingOpportunity + 0x10)
          ;
          p_Var37 = (_Any_data *)&(pHVar6->implications).storeLiftingOpportunity;
          local_f4 = 0;
          ptVar35 = local_68.
                    super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          ptVar41 = local_68.
                    super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            iVar26 = (ptVar41->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                     super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                     super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl;
            lVar39 = (long)iVar26;
            lVar23 = (long)*(int *)(*(long *)&(pHVar6->cliquetable).colsubstituted.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl
                                   + lVar39 * 4);
            if ((((lVar23 != 0) &&
                 (*(long *)&(pHVar6->cliquetable).substitutions.
                            super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                            ._M_impl + lVar23 * 8 != 8)) ||
                (*(char *)(*(long *)&(((pHVar4->domain).mipsolver)->model_->integrality_).
                                     super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
                                     ._M_impl + lVar39) == '\0')) ||
               (((dVar45 = *(double *)
                            (*(long *)&(pHVar4->domain).col_lower_.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl +
                            lVar39 * 8), dVar45 != 0.0 || (NAN(dVar45))) ||
                ((dVar45 = *(double *)
                            (*(long *)&(pHVar4->domain).col_upper_.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl +
                            lVar39 * 8), dVar45 != 1.0 || (NAN(dVar45))))))) {
              iVar38 = 0xb;
            }
            else {
              iVar30 = (this->model->num_col_ + this->model->num_row_) / 0x14;
              if (iVar30 < 0x3e9) {
                iVar30 = 1000;
              }
              iVar38 = 10;
              this->probingEarlyAbort = iVar30 < iVar29;
              if ((iVar29 <= iVar30) &&
                 ((pHVar6->cliquetable).numEntries < (pHVar6->cliquetable).maxEntries)) {
                uVar25 = (int)((ulong)((long)*(pointer *)((long)&(pHVar6->cliquetable).cliques + 8)
                                      - *(long *)&(pHVar6->cliquetable).cliques.
                                                  super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                                                  ._M_impl) >> 2) * -0x33333333 -
                         (int)((ulong)((long)*(pointer *)
                                              ((long)&(pHVar6->cliquetable).freeslots + 8) -
                                      *(long *)&(pHVar6->cliquetable).freeslots.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl) >> 2);
                local_a8 = (ulong)uVar25;
                iVar30 = ((int)((ulong)((long)(this->Avalue).
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                       (long)(this->Avalue).
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start) >> 3) -
                         (int)((ulong)((long)(this->freeslots).
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_finish -
                                      (long)(this->freeslots).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start) >> 2)) * 2;
                if (iVar30 < 0xf4241) {
                  iVar30 = 1000000;
                }
                local_e0 = uVar40;
                if (((((int)(uVar25 + (int)uVar40) <= iVar30) &&
                     ((int)(pHVar6->implications).numImplications - local_98 <= iVar30)) &&
                    ((pHVar6->cliquetable).numNeighbourhoodQueries <= local_d0)) &&
                   ((long)this->numProbed <= this->probingContingent)) {
                  local_88._M_unused._M_member_pointer =
                       local_88._M_unused._M_member_pointer & 0xffffffff00000000;
                  local_d8 = p_Var37;
                  local_b8 = this_02;
                  local_b0 = ptVar35;
                  bVar18 = HighsImplications::runProbing(this_02,iVar26,(HighsInt *)&local_88);
                  iVar38 = 0xb;
                  uVar40 = local_e0;
                  this_02 = local_b8;
                  ptVar35 = local_b0;
                  p_Var37 = local_d8;
                  if (bVar18) {
                    lVar23 = (long)(int)local_88._0_4_ + this->probingContingent;
                    this->probingContingent = lVar23;
                    iVar38 = ((int)((ulong)((long)*(pointer *)
                                                   ((long)&(pHVar6->cliquetable).cliques + 8) -
                                           *(long *)&(pHVar6->cliquetable).cliques.
                                                                                                          
                                                  super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                                                  ._M_impl) >> 2) * -0x33333333 -
                             (int)((ulong)((long)*(pointer *)
                                                  ((long)&(pHVar6->cliquetable).freeslots + 8) -
                                          *(long *)&(pHVar6->cliquetable).freeslots.
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl) >> 2)) - (int)local_a8;
                    iVar26 = 0;
                    if (0 < iVar38) {
                      iVar26 = iVar38;
                    }
                    lVar8 = *(long *)&(pHVar4->domain).changedcols_.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl;
                    lVar36 = (long)*(pointer *)((long)&(pHVar4->domain).changedcols_ + 8) - lVar8 >>
                             2;
                    lVar33 = local_c0;
                    if (lVar36 != local_c0) {
                      local_a8 = CONCAT44(local_a8._4_4_,iVar26);
                      HVar19 = this->probingNumDelCol;
                      lVar32 = *(long *)&(pHVar4->domain).col_lower_.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                      ;
                      lVar34 = *(long *)&(pHVar4->domain).col_upper_.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                      ;
                      do {
                        lVar33 = (long)*(int *)(lVar8 + local_c0 * 4);
                        dVar45 = *(double *)(lVar32 + lVar33 * 8);
                        pdVar1 = (double *)(lVar34 + lVar33 * 8);
                        if ((dVar45 == *pdVar1) && (!NAN(dVar45) && !NAN(*pdVar1))) {
                          HVar19 = HVar19 + 1;
                          this->probingNumDelCol = HVar19;
                        }
                        local_c0 = local_c0 + 1;
                        lVar33 = lVar36;
                      } while (lVar36 != local_c0);
                    }
                    local_c0 = lVar33;
                    iVar30 = (int)((ulong)((long)*(pointer *)
                                                  ((long)&(pHVar6->cliquetable).substitutions + 8) -
                                          *(long *)&(pHVar6->cliquetable).substitutions.
                                                                                                        
                                                  super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                                                  ._M_impl) >> 3) +
                             (this->probingNumDelCol - (int)local_40) +
                             (int)((ulong)((long)*(pointer *)
                                                  ((long)&(pHVar6->implications).substitutions + 8)
                                          - *(long *)&(pHVar6->implications).substitutions.
                                                                                                            
                                                  super__Vector_base<HighsSubstitution,_std::allocator<HighsSubstitution>_>
                                                  ._M_impl) >> 3) * -0x55555555;
                    if (iVar29 < iVar30) {
                      this->probingContingent = lVar23 + iVar29;
                      local_f4 = 0;
                      if (this->mipsolver->submip == false) {
                        local_d0 = local_d0 + (ulong)(uint)(iVar26 * 1000) +
                                   (long)(((int)local_40 + iVar30) * 100);
                      }
                    }
                    else {
                      iVar30 = iVar29;
                      if ((this->mipsolver->submip == false) && (0 < iVar38)) {
                        local_d0 = local_d0 + (ulong)(uint)(iVar26 * 1000);
                        local_f4 = 0;
                      }
                      else {
                        local_d0 = local_d0 - local_f4 * 100;
                        local_f4 = local_f4 + 1;
                      }
                    }
                    this->numProbed = this->numProbed + 1;
                    puVar2 = (this->numProbes).
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar39;
                    *puVar2 = *puVar2 + 1;
                    if ((local_38 <= local_e8) && (*local_48 != (_Manager_type)0x0)) {
                      (**local_48)(local_d8,local_d8,__destroy_functor);
                      *local_48 = (_Manager_type)0x0;
                      local_48[1] = (_Manager_type)0x0;
                    }
                    iVar38 = 0;
                    uVar40 = local_e0;
                    this_02 = local_b8;
                    ptVar35 = local_b0;
                    p_Var37 = local_d8;
                    iVar29 = iVar30;
                    if ((pHVar4->domain).infeasible_ == true) {
                      iVar38 = 1;
                      HighsMipAnalysis::mipTimerStop(&this->mipsolver->analysis_,0xb);
                      uVar40 = local_e0;
                      this_02 = local_b8;
                      ptVar35 = local_b0;
                      p_Var37 = local_d8;
                    }
                  }
                }
              }
            }
            if ((iVar38 != 0xb) && (iVar38 != 0)) goto LAB_00311bd0;
            ptVar41 = ptVar41 + 1;
          } while (ptVar41 != ptVar35);
        }
        iVar38 = 10;
LAB_00311bd0:
        pHVar28 = local_a0;
        RVar22 = kPrimalInfeasible;
        if (iVar38 == 10) {
          HighsCliqueTable::cleanupFixed(this_00,local_a0);
          if (bVar44 != false) {
            HighsCliqueTable::extractCliques(this_00,this->mipsolver,false);
          }
          HighsCliqueTable::runCliqueMerging(this_00,pHVar28);
          piVar12 = *(pointer *)((long)&(pHVar6->cliquetable).deletedrows + 8);
          for (piVar42 = *(int **)&(pHVar6->cliquetable).deletedrows.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl;
              piVar42 != piVar12; piVar42 = piVar42 + 1) {
            if ((this->rowDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_start[*piVar42] == '\0') {
              removeRow(this,*piVar42);
            }
          }
          piVar13 = *(pointer *)
                     &(pHVar6->cliquetable).deletedrows.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl;
          if (*(pointer *)((long)&(pHVar6->cliquetable).deletedrows + 8) != piVar13) {
            *(pointer *)((long)&(pHVar6->cliquetable).deletedrows + 8) = piVar13;
          }
          ppVar43 = *(pointer *)
                     &(pHVar6->cliquetable).cliqueextensions.
                      super__Vector_base<std::pair<int,_HighsCliqueTable::CliqueVar>,_std::allocator<std::pair<int,_HighsCliqueTable::CliqueVar>_>_>
                      ._M_impl;
          ppVar14 = *(pointer *)((long)&(pHVar6->cliquetable).cliqueextensions + 8);
          uVar40 = (ulong)((long)ppVar14 - (long)ppVar43) >> 3;
          iVar29 = (int)uVar40;
          for (; ppVar14 != ppVar43; ppVar43 = ppVar43 + 1) {
            iVar29 = ppVar43->first;
            if ((this->rowDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar29] == '\0') {
              uVar25 = 0x3ff00000;
              if (-1 < (int)ppVar43->second) {
                pHVar24 = this->model;
                pdVar15 = (pHVar24->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                pdVar15[iVar29] = pdVar15[iVar29] + -1.0;
                pdVar15 = (pHVar24->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                pdVar15[iVar29] = pdVar15[iVar29] + -1.0;
                uVar25 = 0xbff00000;
              }
              addToMatrix(this,iVar29,(uint)ppVar43->second & 0x7fffffff,
                          (double)((ulong)uVar25 << 0x20));
            }
            else {
              uVar40 = (ulong)((int)uVar40 - 1);
            }
            iVar29 = (int)uVar40;
          }
          ppVar43 = *(pointer *)
                     &(pHVar6->cliquetable).cliqueextensions.
                      super__Vector_base<std::pair<int,_HighsCliqueTable::CliqueVar>,_std::allocator<std::pair<int,_HighsCliqueTable::CliqueVar>_>_>
                      ._M_impl;
          if (*(pointer *)((long)&(pHVar6->cliquetable).cliqueextensions + 8) != ppVar43) {
            *(pointer *)((long)&(pHVar6->cliquetable).cliqueextensions + 8) = ppVar43;
          }
          pHVar24 = this->model;
          bVar44 = pHVar24->num_col_ == 0;
          iVar38 = 1;
          RVar21 = kPrimalInfeasible;
          if (!bVar44) {
            uVar40 = 0;
            do {
              if ((this->colDeleted).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar40] == '\0') {
                dVar45 = *(double *)
                          (*(long *)&(pHVar4->domain).col_lower_.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl +
                          uVar40 * 8);
                pdVar1 = (pHVar24->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start + uVar40;
                HVar19 = (HighsInt)uVar40;
                if (*pdVar1 <= dVar45 && dVar45 != *pdVar1) {
                  changeColLower(this,HVar19,dVar45);
                }
                dVar45 = *(double *)
                          (*(long *)&(pHVar4->domain).col_upper_.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl +
                          uVar40 * 8);
                if (dVar45 < (this->model->col_upper_).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar40]) {
                  changeColUpper(this,HVar19,dVar45);
                }
                dVar45 = *(double *)
                          (*(long *)&(pHVar4->domain).col_lower_.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl +
                          uVar40 * 8);
                pdVar1 = (double *)
                         (*(long *)&(pHVar4->domain).col_upper_.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl +
                         uVar40 * 8);
                if ((dVar45 == *pdVar1) && (!NAN(dVar45) && !NAN(*pdVar1))) {
                  HighsPostsolveStack::removedFixedCol<HighsEmptySlice>
                            (local_c8,HVar19,
                             (this->model->col_lower_).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar40],0.0,
                             (HighsMatrixSlice<HighsEmptySlice> *)&local_88);
                  removeFixedCol(this,HVar19);
                }
                RVar21 = checkLimits(this,local_c8);
                if (RVar21 != kOk) break;
              }
              RVar21 = kPrimalInfeasible;
              uVar40 = uVar40 + 1;
              pHVar24 = this->model;
              bVar44 = uVar40 == (uint)pHVar24->num_col_;
            } while (!bVar44);
          }
          RVar22 = RVar21;
          if ((bVar44) && (RVar22 = applyConflictGraphSubstitutions(this,local_c8), RVar22 == kOk))
          {
            highsLogDev(&(this->options->super_HighsOptionsStruct).log_options,kInfo,
                        "%d probing evaluations: %d deleted rows, %d deleted columns, %d lifted nonzeros\n"
                        ,(ulong)(uint)(this->numProbed - local_94),(ulong)(uint)this->numDeletedRows
                        ,(ulong)(uint)this->numDeletedCols,iVar29);
            if ((this->mipsolver->options_mip_->super_HighsOptionsStruct).mip_lifting_for_probing !=
                -1) {
              if ((this->numDeletedRows == 0) && (iVar29 == 0 && this->numDeletedCols == 0)) {
                RVar22 = liftingForProbing(this,local_c8);
                iVar38 = 1;
                if (RVar22 != kOk) goto LAB_00311eec;
              }
              std::
              _Hashtable<int,_std::pair<const_int,_HighsHashTree<std::pair<int,_int>,_double>_>,_std::allocator<std::pair<const_int,_HighsHashTree<std::pair<int,_int>,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::clear(&(this->liftingOpportunities)._M_h);
              p_Var16 = *(_Manager_type *)
                         ((long)&(pHVar6->implications).storeLiftingOpportunity + 0x10);
              if (p_Var16 != (_Manager_type)0x0) {
                p_Var37 = (_Any_data *)&(pHVar6->implications).storeLiftingOpportunity;
                (*p_Var16)(p_Var37,p_Var37,__destroy_functor);
                *(_Manager_type *)((long)&(pHVar6->implications).storeLiftingOpportunity + 0x10) =
                     (_Manager_type)0x0;
                *(_Invoker_type *)((long)&(pHVar6->implications).storeLiftingOpportunity + 0x18) =
                     (_Invoker_type)0x0;
              }
            }
            iVar38 = 0;
            RVar22 = RVar21;
          }
        }
LAB_00311eec:
        if (iVar38 != 0) goto LAB_00311f13;
      }
      HighsMipAnalysis::mipTimerStop(&this->mipsolver->analysis_,0xb);
      RVar22 = checkLimits(this,local_c8);
LAB_00311f13:
      if (local_68.
          super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
        return RVar22;
      }
      operator_delete(local_68.
                      super__Vector_base<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      return RVar22;
    }
  }
  this_01 = &this->mipsolver->analysis_;
LAB_003114bc:
  HighsMipAnalysis::mipTimerStop(this_01,0xb);
  return kPrimalInfeasible;
}

Assistant:

HPresolve::Result HPresolve::runProbing(HighsPostsolveStack& postsolve_stack) {
  mipsolver->analysis_.mipTimerStart(kMipClockProbingPresolve);
  probingEarlyAbort = false;
  if (numDeletedCols + numDeletedRows != 0) shrinkProblem(postsolve_stack);

  toCSC(model->a_matrix_.value_, model->a_matrix_.index_,
        model->a_matrix_.start_);
  okFromCSC(model->a_matrix_.value_, model->a_matrix_.index_,
            model->a_matrix_.start_);

  mipsolver->mipdata_->cliquetable.setMaxEntries(numNonzeros());

  // first tighten all bounds if they have an implied bound that is tighter
  // than their column bound before probing this is not done for continuous
  // columns since it may allow stronger dual presolve and more aggregations
  double hugeBound = primal_feastol / kHighsTiny;
  for (HighsInt i = 0; i != model->num_col_; ++i) {
    if (model->col_lower_[i] >= implColLower[i] &&
        model->col_upper_[i] <= implColUpper[i])
      continue;

    if (std::abs(implColLower[i]) <= hugeBound) {
      double newLb = implColLower[i];
      if (newLb > model->col_lower_[i]) changeColLower(i, newLb);
    }

    if (std::abs(implColUpper[i]) <= hugeBound) {
      double newUb = implColUpper[i];
      if (newUb < model->col_upper_[i]) changeColUpper(i, newUb);
    }
  }

  HighsInt oldNumProbed = numProbed;

  mipsolver->mipdata_->setupDomainPropagation();
  HighsDomain& domain = mipsolver->mipdata_->domain;

  domain.propagate();
  if (domain.infeasible()) {
    mipsolver->analysis_.mipTimerStop(kMipClockProbingPresolve);
    return Result::kPrimalInfeasible;
  }
  HighsCliqueTable& cliquetable = mipsolver->mipdata_->cliquetable;
  HighsImplications& implications = mipsolver->mipdata_->implications;
  bool firstCall = !mipsolver->mipdata_->cliquesExtracted;
  mipsolver->mipdata_->cliquesExtracted = true;

  // extract cliques that are part of the formulation every time before probing
  // after the first call we only add cliques that directly correspond to set
  // packing constraints so that the clique merging step can extend/delete them
  if (firstCall) {
    cliquetable.extractCliques(*mipsolver);
    if (domain.infeasible()) {
      mipsolver->analysis_.mipTimerStop(kMipClockProbingPresolve);
      return Result::kPrimalInfeasible;
    }

    // during presolve we keep the objective upper bound without the current
    // offset so we need to update it

    if (mipsolver->mipdata_->upper_limit != kHighsInf) {
      double tmpLimit = mipsolver->mipdata_->upper_limit;
      mipsolver->mipdata_->upper_limit = tmpLimit - model->offset_;
      cliquetable.extractObjCliques(*mipsolver);
      mipsolver->mipdata_->upper_limit = tmpLimit;

      if (domain.infeasible()) {
        mipsolver->analysis_.mipTimerStop(kMipClockProbingPresolve);
        return Result::kPrimalInfeasible;
      }
    }

    domain.propagate();
    if (domain.infeasible()) {
      mipsolver->analysis_.mipTimerStop(kMipClockProbingPresolve);
      return Result::kPrimalInfeasible;
    }
  }

  cliquetable.cleanupFixed(domain);
  if (domain.infeasible()) {
    mipsolver->analysis_.mipTimerStop(kMipClockProbingPresolve);
    return Result::kPrimalInfeasible;
  }

  // store binary variables in vector with their number of implications on
  // other binaries
  std::vector<std::tuple<int64_t, HighsInt, HighsInt, HighsInt>> binaries;

  if (!mipsolver->mipdata_->cliquetable.isFull()) {
    binaries.reserve(model->num_col_);
    HighsRandom random(options->random_seed);
    for (HighsInt i = 0; i != model->num_col_; ++i) {
      if (domain.isBinary(i)) {
        HighsInt implicsUp = cliquetable.getNumImplications(i, 1);
        HighsInt implicsDown = cliquetable.getNumImplications(i, 0);
        binaries.emplace_back(
            -std::min(int64_t{5000}, int64_t(implicsUp) * implicsDown) /
                (1.0 + numProbes[i]),
            -std::min(HighsInt{100}, implicsUp + implicsDown), random.integer(),
            i);
      }
    }
  }
  if (!binaries.empty()) {
    // sort variables with many implications on other binaries first
    pdqsort(binaries.begin(), binaries.end());

    size_t numChangedCols = 0;
    while (domain.getChangedCols().size() != numChangedCols) {
      if (domain.isFixed(domain.getChangedCols()[numChangedCols++]))
        ++probingNumDelCol;
    }

    HighsInt numCliquesStart = cliquetable.numCliques();
    HighsInt numImplicsStart = implications.getNumImplications();
    HighsInt numDelStart = probingNumDelCol;

    HighsInt numDel = probingNumDelCol - numDelStart +
                      implications.substitutions.size() +
                      cliquetable.getSubstitutions().size();
    int64_t splayContingent =
        cliquetable.numNeighbourhoodQueries +
        std::max(mipsolver->submip ? HighsInt{0} : HighsInt{100000},
                 10 * numNonzeros());
    HighsInt numFail = 0;

    // lambda to check if model has enough continuous variables to perform
    // lifting for probing
    auto modelHasPercentageContVars = [&](size_t percentage) {
      size_t num_cols = 0, num_cont_cols = 0;
      for (size_t col = 0; col < colsize.size(); col++) {
        if (colDeleted[col]) continue;
        num_cols++;
        if (model->integrality_[col] == HighsVarType::kContinuous)
          num_cont_cols++;
      }
      return size_t{100} * num_cont_cols >= percentage * num_cols;
    };

    // collect up to 10 lifting opportunities per row
    const size_t maxNumLiftOpps = std::max(
        size_t{100000}, size_t{10} * static_cast<size_t>(model->num_row_));

    // only search for lifting opportunities if at least 2 percent of the
    // variables in the problem are continuous
    size_t numLiftOpps = 0;
    if (mipsolver->options_mip_->mip_lifting_for_probing != -1 &&
        modelHasPercentageContVars(size_t{2})) {
      // store lifting opportunities
      implications.storeLiftingOpportunity = [&](HighsInt row, HighsInt col,
                                                 HighsInt val, double coef) {
        // find lifting opportunities for row
        auto& htree = liftingOpportunities[row];
        // add element
        auto insertresult = htree.insert_or_get(std::make_pair(col, val), coef);
        assert(insertresult.second);
        numLiftOpps++;
      };
    }

    for (const auto& binvar : binaries) {
      HighsInt i = std::get<3>(binvar);

      if (cliquetable.getSubstitution(i) != nullptr || !domain.isBinary(i))
        continue;

      // when a large percentage of columns have been deleted, stop this round
      // of probing
      // if (numDel > std::max(model->num_col_ * 0.2, 1000.)) break;
      probingEarlyAbort =
          numDel >
          std::max(HighsInt{1000}, (model->num_row_ + model->num_col_) / 20);
      if (probingEarlyAbort) break;

      // break in case of too many new implications to not spent ages in
      // probing
      if (cliquetable.isFull() ||
          cliquetable.numCliques() - numCliquesStart >
              std::max(HighsInt{1000000}, 2 * numNonzeros()) ||
          implications.getNumImplications() - numImplicsStart >
              std::max(HighsInt{1000000}, 2 * numNonzeros()))
        break;

      // if (numProbed % 10 == 0)
      //   printf(
      //       "numprobed=%d  numDel=%d  newcliques=%d "
      //       "numNeighbourhoodQueries=%ld  "
      //       "splayContingent=%ld\n",
      //       numProbed, numDel, cliquetable.numCliques() - numCliquesStart,
      //       cliquetable.numNeighbourhoodQueries, splayContingent);
      if (cliquetable.numNeighbourhoodQueries > splayContingent) break;

      if (probingContingent - numProbed < 0) break;

      HighsInt numBoundChgs = 0;
      HighsInt numNewCliques = -cliquetable.numCliques();
      const bool probing_result = implications.runProbing(i, numBoundChgs);
      if (!probing_result) continue;
      probingContingent += numBoundChgs;
      numNewCliques += cliquetable.numCliques();
      numNewCliques = std::max(numNewCliques, HighsInt{0});
      while (domain.getChangedCols().size() != numChangedCols) {
        if (domain.isFixed(domain.getChangedCols()[numChangedCols++]))
          ++probingNumDelCol;
      }
      HighsInt newNumDel = probingNumDelCol - numDelStart +
                           implications.substitutions.size() +
                           cliquetable.getSubstitutions().size();

      if (newNumDel > numDel) {
        probingContingent += numDel;
        if (!mipsolver->submip) {
          splayContingent += 100 * (newNumDel + numDelStart);
          splayContingent += 1000 * numNewCliques;
        }
        numDel = newNumDel;
        numFail = 0;
      } else if (mipsolver->submip || numNewCliques == 0) {
        splayContingent -= 100 * numFail;
        ++numFail;
      } else {
        splayContingent += 1000 * numNewCliques;
        numFail = 0;
      }

      ++numProbed;
      numProbes[i] += 1;

      // Stop collecting lifting opportunities if maximum is reached
      if (numLiftOpps >= maxNumLiftOpps)
        implications.storeLiftingOpportunity = nullptr;

      // printf("nprobed: %" HIGHSINT_FORMAT ", numCliques: %" HIGHSINT_FORMAT
      // "\n", nprobed,
      //       cliquetable.numCliques());
      if (domain.infeasible()) {
        mipsolver->analysis_.mipTimerStop(kMipClockProbingPresolve);
        return Result::kPrimalInfeasible;
      }
    }

    cliquetable.cleanupFixed(domain);

    if (!firstCall) cliquetable.extractCliques(*mipsolver, false);
    cliquetable.runCliqueMerging(domain);

    // apply changes from probing

    // first delete redundant clique inequalities
    for (HighsInt delrow : cliquetable.getDeletedRows())
      if (!rowDeleted[delrow]) removeRow(delrow);
    cliquetable.getDeletedRows().clear();

    // add nonzeros from clique lifting before removing fixed variables, since
    // this might lead to stronger constraint sides
    auto& extensionvars = cliquetable.getCliqueExtensions();
    HighsInt addednnz = extensionvars.size();
    for (const auto& cliqueextension : extensionvars) {
      if (rowDeleted[cliqueextension.first]) {
        --addednnz;
        continue;
      }
      double val;
      if (cliqueextension.second.val == 0) {
        model->row_lower_[cliqueextension.first] -= 1;
        model->row_upper_[cliqueextension.first] -= 1;
        val = -1.0;
      } else
        val = 1.0;
      addToMatrix(cliqueextension.first, cliqueextension.second.col, val);
    }
    extensionvars.clear();

    // now remove fixed columns and tighten domains
    for (HighsInt i = 0; i != model->num_col_; ++i) {
      if (colDeleted[i]) continue;
      if (model->col_lower_[i] < domain.col_lower_[i])
        changeColLower(i, domain.col_lower_[i]);
      if (model->col_upper_[i] > domain.col_upper_[i])
        changeColUpper(i, domain.col_upper_[i]);
      if (domain.isFixed(i)) {
        postsolve_stack.removedFixedCol(i, model->col_lower_[i], 0.0,
                                        HighsEmptySlice());
        removeFixedCol(i);
      }
      HPRESOLVE_CHECKED_CALL(checkLimits(postsolve_stack));
    }

    // finally apply substitutions
    HPRESOLVE_CHECKED_CALL(applyConflictGraphSubstitutions(postsolve_stack));

    highsLogDev(options->log_options, HighsLogType::kInfo,
                "%" HIGHSINT_FORMAT " probing evaluations: %" HIGHSINT_FORMAT
                " deleted rows, %" HIGHSINT_FORMAT
                " deleted "
                "columns, %" HIGHSINT_FORMAT " lifted nonzeros\n",
                numProbed - oldNumProbed, numDeletedRows, numDeletedCols,
                addednnz);

    // lifting for probing
    if (mipsolver->options_mip_->mip_lifting_for_probing != -1) {
      // only perform lifting if probing did not modify the problem so far
      if (numDeletedRows == 0 && numDeletedCols == 0 && addednnz == 0)
        HPRESOLVE_CHECKED_CALL(liftingForProbing(postsolve_stack));
      // clear lifting opportunities
      liftingOpportunities.clear();
      implications.storeLiftingOpportunity = nullptr;
    }
  }

  mipsolver->analysis_.mipTimerStop(kMipClockProbingPresolve);
  return checkLimits(postsolve_stack);
}